

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandReporter.cpp
# Opt level: O1

void __thiscall
ApprovalTests::CommandReporter::useCygwinConversions(CommandReporter *this,bool useCygwin)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_cp_type *__mem;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined *puVar2;
  undefined3 in_register_00000031;
  
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00165528;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  if (CONCAT31(in_register_00000031,useCygwin) == 0) {
    p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00166a90;
    puVar2 = &DoNothing::vtable;
  }
  else {
    p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00166a40;
    puVar2 = &ConvertForCygwin::vtable;
  }
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)(puVar2 + 0x10);
  (this->converter).super___shared_ptr<ApprovalTests::ConvertForCygwin,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)(p_Var1 + 1);
  this_00 = (this->converter).
            super___shared_ptr<ApprovalTests::ConvertForCygwin,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->converter).super___shared_ptr<ApprovalTests::ConvertForCygwin,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

void CommandReporter::useCygwinConversions(bool useCygwin)
    {
        if (useCygwin)
        {
            converter = std::make_shared<ConvertForCygwin>();
        }
        else
        {
            converter = std::make_shared<DoNothing>();
        }
    }